

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_daemon.c
# Opt level: O0

int zt_daemonize(char *root,mode_t mask,int options)

{
  __pid_t _Var1;
  int iVar2;
  int iVar3;
  int *piVar4;
  char *pcVar5;
  __mode_t in_ESI;
  char *in_RDI;
  int fd;
  rlimit rlimits;
  int status;
  rlim_t i;
  pid_t pid2;
  pid_t pid;
  rlimit local_38;
  undefined1 local_24 [4];
  ulong local_20;
  __pid_t local_18;
  __pid_t local_14;
  __mode_t local_c;
  char *local_8;
  
  local_c = in_ESI;
  local_8 = in_RDI;
  local_14 = fork();
  if (local_14 == -1) {
    piVar4 = __errno_location();
    pcVar5 = strerror(*piVar4);
    zt_log_lprintf((zt_log_ty *)0x0,zt_log_emerg,"failed to fork(): %s",pcVar5);
    exit(1);
  }
  if (local_14 != 0) {
    wait(local_24);
    exit(0);
  }
  _Var1 = setsid();
  if (_Var1 == -1) {
    piVar4 = __errno_location();
    pcVar5 = strerror(*piVar4);
    zt_log_lprintf((zt_log_ty *)0x0,zt_log_emerg,"faild to setsid(): %s",pcVar5);
    exit(1);
  }
  memset(&local_38,0,0x10);
  iVar2 = getrlimit(RLIMIT_NOFILE,&local_38);
  if (iVar2 != -1) {
    for (local_20 = 0; local_20 < local_38.rlim_cur; local_20 = local_20 + 1) {
      if (0x7fffffff < local_20) {
        local_20 = 0x7fffffff;
      }
      close((int)local_20);
    }
    local_18 = fork();
    if (local_18 == -1) {
      exit(1);
    }
    if (local_18 != 0) {
      sleep(1);
      exit(0);
    }
    if ((local_8 != (char *)0x0) && (iVar2 = chdir(local_8), iVar2 != 0)) {
      zt_log_lprintf((zt_log_ty *)0x0,zt_log_crit,"Could not chdir %s",local_8);
      exit(1);
    }
    umask(local_c);
    iVar2 = open("/dev/null",2);
    iVar3 = dup(iVar2);
    if (iVar3 == -1) {
      zt_log_lprintf((zt_log_ty *)0x0,zt_log_crit,"Could not send stdout to /dev/null");
    }
    iVar2 = dup(iVar2);
    if (iVar2 == -1) {
      zt_log_lprintf((zt_log_ty *)0x0,zt_log_crit,"Could not send stderr to /dev/null");
    }
    return 0;
  }
  piVar4 = __errno_location();
  pcVar5 = strerror(*piVar4);
  zt_log_lprintf((zt_log_ty *)0x0,zt_log_emerg,"faild to getlimit(): %s",pcVar5);
  exit(1);
}

Assistant:

int
zt_daemonize( char *root, mode_t mask, int options UNUSED)
{
    pid_t         pid;
    pid_t         pid2;
    rlim_t        i;
    int           status;
    struct rlimit rlimits;

    if ((pid = fork()) == (pid_t)(-1)) { /* first error */
        zt_log_printf(zt_log_emerg, "failed to fork(): %s", strerror(errno));
        exit(1);
    } else if (pid == 0) {  /* first child */
        /* FIXME: Not everyone has setsid.  Add support for them. */
        if (setsid() == -1) {
            zt_log_printf(zt_log_emerg, "faild to setsid(): %s", strerror(errno));
            exit(1);
        }

        /* get the max number of open fd and close them */
        memset(&rlimits, 0, sizeof(struct rlimit));
        if (getrlimit(RLIMIT_NOFILE, &rlimits) == -1) {
            zt_log_printf(zt_log_emerg, "faild to getlimit(): %s", strerror(errno));
            exit(1);
        }
        for (i = 0; i < rlimits.rlim_cur; i++) {
            if (i > INT_MAX) {
                /* int cast protection */
                i = INT_MAX;
            }
            close((int)i);
        }                                                  /* Close all of the filehandles */

        if ((pid2 = fork()) == (pid_t)(-1)) {
            /* We can't produce an error here as we have already
             * closed all of the file descriptors
             */
            exit(1);
        } else if (pid2 == 0) { /* second child */
            int fd;

            if (root != NULL) {
                if(chdir(root) != 0) {
                    zt_log_printf(zt_log_crit, "Could not chdir %s", root);
                    exit(1);
                }
            }
            umask(mask);
            fd = open("/dev/null", O_RDWR);    /* stdin */

            /* we don't care about the results as we have no open pids at this point */
            if(dup(fd) == -1) { /* stdout */
              zt_log_printf(zt_log_crit, "Could not send stdout to /dev/null");
            }

            if(dup(fd) == -1) { /* stderr */
              zt_log_printf(zt_log_crit, "Could not send stderr to /dev/null");
            }

        } else {                                           /* second parent */
            sleep(1);
            exit(0);
        }
    } else {    /* first parent */
        /* wait here for the first child to exit */
        wait(&status);
        exit(0);
    }

    /* At this point we are in the second child properly forked and closed off */
    return 0;
}